

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939acd.c
# Opt level: O2

void sighandler(int sig,siginfo_t *info,void *vp)

{
  if (sig == 0xf) {
    s.signal_num = sig;
    return;
  }
  if (sig == 10) {
    s.sig_usr1 = 1;
  }
  else {
    if (sig == 0xe) {
      s.sig_alrm = 1;
      return;
    }
    if (sig == 2) {
      s.signal_num = sig;
      return;
    }
  }
  return;
}

Assistant:

static void sighandler(int sig, siginfo_t *info, void *vp)
{
	switch (sig) {
	case SIGINT:
	case SIGTERM:
		s.signal_num = sig;
		break;
	case SIGALRM:
		s.sig_alrm = 1;
		break;
	case SIGUSR1:
		s.sig_usr1 = 1;
		break;
	}
}